

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int close_get_error(CLOSE_HANDLE close,ERROR_HANDLE *error_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  CLOSE_INSTANCE *close_instance;
  uint32_t item_count;
  int result;
  ERROR_HANDLE *error_value_local;
  CLOSE_HANDLE close_local;
  
  if (close == (CLOSE_HANDLE)0x0) {
    close_instance._4_4_ = 0x2731;
  }
  else {
    _item_count = error_value;
    error_value_local = (ERROR_HANDLE *)close;
    iVar1 = amqpvalue_get_composite_item_count(close->composite_value,(uint32_t *)&close_instance);
    if (iVar1 == 0) {
      if ((int)close_instance == 0) {
        close_instance._4_4_ = 0x273f;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(close->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          close_instance._4_4_ = 0x2747;
        }
        else {
          iVar1 = amqpvalue_get_error(value,_item_count);
          if (iVar1 == 0) {
            close_instance._4_4_ = 0;
          }
          else {
            close_instance._4_4_ = 0x274e;
          }
        }
      }
    }
    else {
      close_instance._4_4_ = 0x2739;
    }
  }
  return close_instance._4_4_;
}

Assistant:

int close_get_error(CLOSE_HANDLE close, ERROR_HANDLE* error_value)
{
    int result;

    if (close == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close;
        if (amqpvalue_get_composite_item_count(close_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(close_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_error(item_value, error_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}